

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O3

void __thiscall
Assimp::ASEImporter::AddNodes
          (ASEImporter *this,
          vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *nodes,
          aiNode *pcParent,char *szName,aiMatrix4x4 *mat)

{
  float fVar1;
  BaseNode *snode;
  size_type sVar2;
  pointer pcVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  aiMatrix4x4 *paVar15;
  _IEEESingle temp;
  int iVar16;
  ai_uint32 aVar17;
  uint uVar18;
  aiNode *paVar19;
  size_t sVar20;
  aiNode **ppaVar21;
  aiNode *paVar22;
  ulong uVar23;
  Logger *this_00;
  long *plVar24;
  long lVar25;
  aiNode **ppaVar26;
  long *plVar27;
  char *pcVar28;
  pointer ppBVar29;
  vector<aiNode_*,_std::allocator<aiNode_*>_> apcNodes;
  aiMatrix4x4 mParentAdjust;
  aiNode **local_128;
  iterator iStack_120;
  aiNode **local_118;
  long *local_110;
  ulong local_108;
  long local_100;
  long lStack_f8;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *local_f0;
  aiNode *local_e8;
  char *local_e0;
  ASEImporter *local_d8;
  size_type local_d0;
  aiMatrix4x4t<float> local_c8;
  aiMatrix4x4 *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  pointer local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_f0 = nodes;
  local_e0 = szName;
  local_d8 = this;
  if (szName == (char *)0x0) {
    local_d0 = 0;
  }
  else {
    local_d0 = strlen(szName);
  }
  local_128 = (aiNode **)0x0;
  iStack_120._M_current = (aiNode **)0x0;
  local_118 = (aiNode **)0x0;
  ppBVar29 = (local_f0->
             super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  local_70 = (local_f0->
             super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  pcVar28 = local_e0;
  paVar19 = pcParent;
  paVar15 = mat;
  if (ppBVar29 != local_70) {
    do {
      local_80 = paVar15;
      local_e8 = paVar19;
      snode = *ppBVar29;
      sVar2 = (snode->mParent)._M_string_length;
      if (pcVar28 == (char *)0x0) {
        if (sVar2 == 0) goto LAB_003e1334;
      }
      else if ((local_d0 == sVar2) &&
              (iVar16 = strcmp(pcVar28,(snode->mParent)._M_dataplus._M_p), iVar16 == 0)) {
LAB_003e1334:
        snode->mProcessed = true;
        paVar19 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar19);
        local_c8._0_8_ = paVar19;
        if (iStack_120._M_current == local_118) {
          std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*>
                    ((vector<aiNode*,std::allocator<aiNode*>> *)&local_128,iStack_120,
                     (aiNode **)&local_c8);
        }
        else {
          *iStack_120._M_current = paVar19;
          iStack_120._M_current = iStack_120._M_current + 1;
        }
        paVar19 = iStack_120._M_current[-1];
        local_78 = &snode->mName;
        pcVar28 = "Unnamed_Node";
        if ((snode->mName)._M_string_length != 0) {
          pcVar28 = (local_78->_M_dataplus)._M_p;
        }
        sVar20 = strlen(pcVar28);
        aVar17 = (ai_uint32)sVar20;
        if ((int)aVar17 < 0x400) {
          (paVar19->mName).length = aVar17;
          memcpy((paVar19->mName).data,pcVar28,(long)(int)aVar17);
          (paVar19->mName).data[(int)aVar17] = '\0';
        }
        paVar19->mParent = local_e8;
        local_c8.a1 = mat->a1;
        local_c8.a2 = mat->a2;
        local_c8.a3 = mat->a3;
        local_c8.a4 = mat->a4;
        local_c8.b1 = mat->b1;
        local_c8.b2 = mat->b2;
        local_c8.b3 = mat->b3;
        local_c8.b4 = mat->b4;
        local_c8.c1 = mat->c1;
        local_c8.c2 = mat->c2;
        local_c8.c3 = mat->c3;
        local_c8.c4 = mat->c4;
        local_c8.d1 = mat->d1;
        local_c8.d2 = mat->d2;
        local_c8.d3 = mat->d3;
        local_c8.d4 = mat->d4;
        aiMatrix4x4t<float>::Inverse(&local_c8);
        local_48 = (snode->mTransform).a1;
        fStack_44 = (snode->mTransform).a2;
        fStack_40 = (snode->mTransform).a3;
        fStack_3c = (snode->mTransform).a4;
        fVar1 = (snode->mTransform).b1;
        fVar4 = (snode->mTransform).b2;
        fVar5 = (snode->mTransform).b3;
        fVar6 = (snode->mTransform).b4;
        fVar7 = (snode->mTransform).c1;
        fVar8 = (snode->mTransform).c2;
        fVar9 = (snode->mTransform).c3;
        fVar10 = (snode->mTransform).c4;
        fVar11 = (snode->mTransform).d1;
        fVar12 = (snode->mTransform).d2;
        fVar13 = (snode->mTransform).d3;
        fVar14 = (snode->mTransform).d4;
        (paVar19->mTransformation).a1 =
             local_c8.a4 * fVar11 +
             local_c8.a3 * fVar7 + local_c8.a1 * local_48 + local_c8.a2 * fVar1;
        (paVar19->mTransformation).a2 =
             local_c8.a4 * fVar12 +
             local_c8.a3 * fVar8 + local_c8.a1 * fStack_44 + local_c8.a2 * fVar4;
        (paVar19->mTransformation).a3 =
             local_c8.a4 * fVar13 +
             local_c8.a3 * fVar9 + local_c8.a1 * fStack_40 + local_c8.a2 * fVar5;
        (paVar19->mTransformation).a4 =
             local_c8.a4 * fVar14 +
             local_c8.a3 * fVar10 + local_c8.a1 * fStack_3c + local_c8.a2 * fVar6;
        (paVar19->mTransformation).b1 =
             local_c8.b4 * fVar11 +
             local_c8.b3 * fVar7 + local_c8.b1 * local_48 + local_c8.b2 * fVar1;
        (paVar19->mTransformation).b2 =
             local_c8.b4 * fVar12 +
             local_c8.b3 * fVar8 + local_c8.b1 * fStack_44 + local_c8.b2 * fVar4;
        (paVar19->mTransformation).b3 =
             local_c8.b4 * fVar13 +
             local_c8.b3 * fVar9 + local_c8.b1 * fStack_40 + local_c8.b2 * fVar5;
        (paVar19->mTransformation).b4 =
             local_c8.b4 * fVar14 +
             local_c8.b3 * fVar10 + local_c8.b1 * fStack_3c + local_c8.b2 * fVar6;
        (paVar19->mTransformation).c1 =
             local_c8.c4 * fVar11 +
             local_c8.c3 * fVar7 + local_c8.c1 * local_48 + local_c8.c2 * fVar1;
        (paVar19->mTransformation).c2 =
             local_c8.c4 * fVar12 +
             local_c8.c3 * fVar8 + local_c8.c1 * fStack_44 + local_c8.c2 * fVar4;
        (paVar19->mTransformation).c3 =
             local_c8.c4 * fVar13 +
             local_c8.c3 * fVar9 + local_c8.c1 * fStack_40 + local_c8.c2 * fVar5;
        (paVar19->mTransformation).c4 =
             local_c8.c4 * fVar14 +
             local_c8.c3 * fVar10 + local_c8.c1 * fStack_3c + local_c8.c2 * fVar6;
        (paVar19->mTransformation).d1 =
             local_c8.d4 * fVar11 +
             local_c8.d3 * fVar7 + local_c8.d1 * local_48 + local_c8.d2 * fVar1;
        (paVar19->mTransformation).d2 =
             local_c8.d4 * fVar12 +
             local_c8.d3 * fVar8 + local_c8.d1 * fStack_44 + local_c8.d2 * fVar4;
        (paVar19->mTransformation).d3 =
             local_c8.d4 * fVar13 +
             local_c8.d3 * fVar9 + local_c8.d1 * fStack_40 + local_c8.d2 * fVar5;
        (paVar19->mTransformation).d4 =
             local_c8.d4 * fVar14 +
             local_c8.d3 * fVar10 + local_c8.d1 * fStack_3c + local_c8.d2 * fVar6;
        paVar22 = paVar19->mParent;
        uVar18 = (paVar19->mName).length;
        if (((uVar18 != (paVar22->mName).length) ||
            (iVar16 = bcmp((paVar19->mName).data,(paVar22->mName).data,(ulong)uVar18), iVar16 != 0))
           && ((uVar18 != (paVar22->mParent->mName).length ||
               (iVar16 = bcmp((paVar19->mName).data,(paVar22->mParent->mName).data,(ulong)uVar18),
               iVar16 != 0)))) {
          AddNodes(local_d8,local_f0,paVar19,(paVar19->mName).data,&snode->mTransform);
        }
        if (snode->mType == Mesh) {
          AddMeshes(local_d8,snode,paVar19);
          pcVar28 = local_e0;
        }
        else {
          fVar1 = (snode->mTargetPosition).x;
          pcVar28 = local_e0;
          if ((~(uint)fVar1 & 0x7f800000) != 0 || ((uint)fVar1 & 0x7fffff) == 0) {
            if (paVar19->mNumChildren == 0) {
              ppaVar21 = (aiNode **)operator_new__(8);
              paVar19->mChildren = ppaVar21;
            }
            paVar22 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar22);
            pcVar3 = (snode->mName)._M_dataplus._M_p;
            local_110 = &local_100;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,pcVar3,pcVar3 + (snode->mName)._M_string_length);
            std::__cxx11::string::append((char *)&local_110);
            uVar23 = local_108;
            plVar24 = local_110;
            if (local_108 < 0x400) {
              (paVar22->mName).length = (ai_uint32)local_108;
              memcpy((paVar22->mName).data,local_110,local_108);
              (paVar22->mName).data[uVar23] = '\0';
            }
            if (plVar24 != &local_100) {
              operator_delete(plVar24);
            }
            mat = local_80;
            (paVar22->mTransformation).a4 = (snode->mTargetPosition).x - (snode->mTransform).a4;
            (paVar22->mTransformation).b4 = (snode->mTargetPosition).y - (snode->mTransform).b4;
            (paVar22->mTransformation).c4 = (snode->mTargetPosition).z - (snode->mTransform).c4;
            paVar22->mParent = paVar19;
            if (paVar19->mNumChildren != 0) {
              uVar23 = 0;
              do {
                paVar19->mChildren[uVar23 + 1] = paVar19->mChildren[uVar23];
                uVar23 = uVar23 + 1;
              } while (uVar23 < paVar19->mNumChildren);
            }
            *paVar19->mChildren = paVar22;
            paVar19->mNumChildren = paVar19->mNumChildren + 1;
            this_00 = DefaultLogger::get();
            std::operator+(&local_68,"ASE: Generating separate target node (",local_78);
            plVar24 = (long *)std::__cxx11::string::append((char *)&local_68);
            plVar27 = plVar24 + 2;
            if ((long *)*plVar24 == plVar27) {
              local_100 = *plVar27;
              lStack_f8 = plVar24[3];
              local_110 = &local_100;
            }
            else {
              local_100 = *plVar27;
              local_110 = (long *)*plVar24;
            }
            local_108 = plVar24[1];
            *plVar24 = (long)plVar27;
            plVar24[1] = 0;
            *(undefined1 *)(plVar24 + 2) = 0;
            Logger::debug(this_00,(char *)local_110);
            if (local_110 != &local_100) {
              operator_delete(local_110);
            }
            pcVar28 = local_e0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
              pcVar28 = local_e0;
            }
          }
        }
      }
      ppBVar29 = ppBVar29 + 1;
      pcParent = local_e8;
      paVar19 = local_e8;
      paVar15 = local_80;
    } while (ppBVar29 != local_70);
  }
  ppaVar21 = local_128;
  lVar25 = (long)iStack_120._M_current - (long)local_128 >> 3;
  pcParent->mNumChildren = (uint)lVar25;
  if ((uint)lVar25 != 0) {
    ppaVar26 = (aiNode **)operator_new__(-(ulong)(lVar25 + 1U >> 0x3d != 0) | lVar25 * 8 + 8U);
    pcParent->mChildren = ppaVar26;
    if (iStack_120._M_current != ppaVar21) {
      uVar18 = 1;
      uVar23 = 0;
      do {
        pcParent->mChildren[uVar23] = ppaVar21[uVar23];
        uVar23 = (ulong)uVar18;
        uVar18 = uVar18 + 1;
        ppaVar21 = local_128;
      } while (uVar23 < (ulong)((long)iStack_120._M_current - (long)local_128 >> 3));
    }
  }
  if (ppaVar21 != (aiNode **)0x0) {
    operator_delete(ppaVar21);
  }
  return;
}

Assistant:

void ASEImporter::AddNodes (const std::vector<BaseNode*>& nodes,
    aiNode* pcParent, const char* szName,
    const aiMatrix4x4& mat)
{
    const size_t len = szName ? ::strlen(szName) : 0;
    ai_assert(4 <= AI_MAX_NUMBER_OF_COLOR_SETS);

    // Receives child nodes for the pcParent node
    std::vector<aiNode*> apcNodes;

    // Now iterate through all nodes in the scene and search for one
    // which has *us* as parent.
    for (std::vector<BaseNode*>::const_iterator it = nodes.begin(), end = nodes.end(); it != end; ++it) {
        const BaseNode* snode = *it;
        if (szName) {
            if (len != snode->mParent.length() || ::strcmp(szName,snode->mParent.c_str()))
                continue;
        }
        else if (snode->mParent.length())
            continue;

        (*it)->mProcessed = true;

        // Allocate a new node and add it to the output data structure
        apcNodes.push_back(new aiNode());
        aiNode* node = apcNodes.back();

        node->mName.Set((snode->mName.length() ? snode->mName.c_str() : "Unnamed_Node"));
        node->mParent = pcParent;

        // Setup the transformation matrix of the node
        aiMatrix4x4 mParentAdjust  = mat;
        mParentAdjust.Inverse();
        node->mTransformation = mParentAdjust*snode->mTransform;

        // Add sub nodes - prevent stack overflow due to recursive parenting
        if (node->mName != node->mParent->mName && node->mName != node->mParent->mParent->mName ) {
            AddNodes(nodes,node,node->mName.data,snode->mTransform);
        }

        // Further processing depends on the type of the node
        if (snode->mType == ASE::BaseNode::Mesh)    {
            // If the type of this node is "Mesh" we need to search
            // the list of output meshes in the data structure for
            // all those that belonged to this node once. This is
            // slightly inconvinient here and a better solution should
            // be used when this code is refactored next.
            AddMeshes(snode,node);
        }
        else if (is_not_qnan( snode->mTargetPosition.x ))   {
            // If this is a target camera or light we generate a small
            // child node which marks the position of the camera
            // target (the direction information is contained in *this*
            // node's animation track but the exact target position
            // would be lost otherwise)
            if (!node->mNumChildren)    {
                node->mChildren = new aiNode*[1];
            }

            aiNode* nd = new aiNode();

            nd->mName.Set ( snode->mName + ".Target" );

            nd->mTransformation.a4 = snode->mTargetPosition.x - snode->mTransform.a4;
            nd->mTransformation.b4 = snode->mTargetPosition.y - snode->mTransform.b4;
            nd->mTransformation.c4 = snode->mTargetPosition.z - snode->mTransform.c4;

            nd->mParent = node;

            // The .Target node is always the first child node
            for (unsigned int m = 0; m < node->mNumChildren;++m)
                node->mChildren[m+1] = node->mChildren[m];

            node->mChildren[0] = nd;
            node->mNumChildren++;

            // What we did is so great, it is at least worth a debug message
            ASSIMP_LOG_DEBUG("ASE: Generating separate target node ("+snode->mName+")");
        }
    }

    // Allocate enough space for the child nodes
    // We allocate one slot more  in case this is a target camera/light
    pcParent->mNumChildren = (unsigned int)apcNodes.size();
    if (pcParent->mNumChildren) {
        pcParent->mChildren = new aiNode*[apcNodes.size()+1 /* PLUS ONE !!! */];

        // now build all nodes for our nice new children
        for (unsigned int p = 0; p < apcNodes.size();++p)
            pcParent->mChildren[p] = apcNodes[p];
    }
    return;
}